

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O2

SBuf * strfmt_putquotedlen(SBuf *sb,char *s,MSize len)

{
  char cVar1;
  byte *pbVar2;
  uint uVar3;
  byte *pbVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  
  pbVar2 = (byte *)sb->w;
  if (*(int *)&sb->e == (int)pbVar2) {
    pbVar2 = (byte *)lj_buf_more2(sb,1);
  }
  *pbVar2 = 0x22;
  lVar7 = 0;
  do {
    pbVar2 = pbVar2 + 1;
    sb->w = (char *)pbVar2;
    if (len == (MSize)lVar7) {
      if (*(int *)&sb->e == (int)pbVar2) {
        pbVar2 = (byte *)lj_buf_more2(sb,1);
      }
      *pbVar2 = 0x22;
      sb->w = (char *)(pbVar2 + 1);
      return sb;
    }
    bVar5 = s[lVar7];
    if ((*(int *)&sb->e - (int)pbVar2 & 0xfffffffcU) == 0) {
      pbVar2 = (byte *)lj_buf_more2(sb,4);
    }
    if (((bVar5 == 10) || (bVar5 == 0x5c)) || (bVar5 == 0x22)) {
      *pbVar2 = 0x5c;
      pbVar2 = pbVar2 + 1;
    }
    else if ((""[(ulong)bVar5 + 1] & 1) != 0) {
      *pbVar2 = 0x5c;
      bVar6 = 0x31;
      if ((bVar5 < 100) && (bVar6 = 0x30, (""[(ulong)(byte)s[lVar7 + 1] + 1] & 8) == 0)) {
        pbVar2 = pbVar2 + 1;
        pbVar4 = pbVar2;
        uVar3 = (uint)bVar5;
        if (9 < bVar5) goto LAB_0011631e;
      }
      else {
        pbVar4 = pbVar2 + 2;
        pbVar2[1] = bVar6;
        uVar3 = bVar5 - 100;
        if (bVar5 < 100) {
          uVar3 = (uint)bVar5;
        }
LAB_0011631e:
        cVar1 = (char)(uVar3 * 0xcd >> 0xb);
        bVar5 = cVar1 * -10 + (char)uVar3;
        *pbVar4 = cVar1 + 0x30;
        pbVar2 = pbVar4 + 1;
      }
      bVar5 = bVar5 + 0x30;
    }
    *pbVar2 = bVar5;
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

static SBuf *strfmt_putquotedlen(SBuf *sb, const char *s, MSize len)
{
  lj_buf_putb(sb, '"');
  while (len--) {
    uint32_t c = (uint32_t)(uint8_t)*s++;
    char *w = lj_buf_more(sb, 4);
    if (c == '"' || c == '\\' || c == '\n') {
      *w++ = '\\';
    } else if (lj_char_iscntrl(c)) {  /* This can only be 0-31 or 127. */
      uint32_t d;
      *w++ = '\\';
      if (c >= 100 || lj_char_isdigit((uint8_t)*s)) {
	*w++ = (char)('0'+(c >= 100)); if (c >= 100) c -= 100;
	goto tens;
      } else if (c >= 10) {
      tens:
	d = (c * 205) >> 11; c -= d * 10; *w++ = (char)('0'+d);
      }
      c += '0';
    }
    *w++ = (char)c;
    sb->w = w;
  }
  lj_buf_putb(sb, '"');
  return sb;
}